

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Room.cpp
# Opt level: O1

void __thiscall Room::Room(Room *this,string *long_desc,string *short_desc,int *directions)

{
  _Rb_tree_header *p_Var1;
  int i;
  long lVar2;
  
  (this->m_long_description)._M_dataplus._M_p = (pointer)&(this->m_long_description).field_2;
  (this->m_long_description)._M_string_length = 0;
  (this->m_long_description).field_2._M_local_buf[0] = '\0';
  (this->m_short_description)._M_dataplus._M_p = (pointer)&(this->m_short_description).field_2;
  (this->m_short_description)._M_string_length = 0;
  (this->m_short_description).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->m_player_map)._M_t._M_impl.super__Rb_tree_header;
  (this->m_player_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_player_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_player_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_player_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_player_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_npc_map)._M_t._M_impl.super__Rb_tree_header;
  (this->m_npc_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_npc_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_npc_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_npc_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->m_ships)._M_t._M_impl.super__Rb_tree_header;
  (this->m_ships)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_ships)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_npc_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_ship_ids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->m_ship_ids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->m_ship_ids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->m_ships)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_ships)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_ships)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_items)._M_t._M_impl.super__Rb_tree_header;
  (this->m_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_id = 0;
  std::__cxx11::string::_M_assign((string *)&this->m_long_description);
  std::__cxx11::string::_M_assign((string *)&this->m_short_description);
  lVar2 = 0;
  do {
    this->m_directions[lVar2] = directions[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 10);
  this->m_landing_level = NONE;
  this->m_is_cockpit = false;
  return;
}

Assistant:

Room::Room(const std::string &long_desc, const std::string &short_desc, const int *directions) {
    m_id = 0;
    m_long_description = long_desc;
    m_short_description = short_desc;
    for(int i = 0; i < NUMBER_OF_DIRECTIONS; ++i) {
        m_directions[i] = directions[i];
    }
    m_landing_level = NONE;
    m_is_cockpit = false;
}